

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::
GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
          (java *this,string *package_dir,string *java_package,Descriptor *descriptor,
          GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,bool annotate_code,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_list,string *name_suffix,MessageGenerator *generator,bool opensource_runtime,
          offset_in_MessageGenerator_to_subr pfn)

{
  undefined8 *puVar1;
  ZeroCopyOutputStream *output;
  ZeroCopyOutputStream *output_00;
  AlphaNum *pAVar2;
  code *pcVar3;
  long *plVar4;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  undefined7 in_stack_00000009;
  undefined7 in_stack_00000029;
  string filename;
  string info_full_path;
  GeneratedCodeInfo annotations;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  
  pcVar3 = (code *)CONCAT71(in_stack_00000029,opensource_runtime);
  printer.sink_.buffer_ = *(void **)this;
  printer.sink_.stream_ = *(ZeroCopyOutputStream **)(this + 8);
  annotations.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)(ulong)*(ushort *)(java_package->field_2)._M_allocated_capacity;
  annotations.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       ~(ulong)annotations.super_Message.super_MessageLite._vptr_MessageLite +
       (long)(java_package->field_2)._M_allocated_capacity;
  info_full_path._M_string_length =
       (size_type)
       (annotation_list->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  info_full_path._M_dataplus._M_p =
       (pointer)(annotation_list->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
  pAVar2 = (AlphaNum *)file_list;
  annotation_collector =
       (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>)
       absl::lts_20250127::NullSafeStringView(".java");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&filename,(lts_20250127 *)&printer,(AlphaNum *)&annotations,(AlphaNum *)&info_full_path
             ,(AlphaNum *)&annotation_collector,pAVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)context,&filename);
  printer.sink_.stream_ = (ZeroCopyOutputStream *)filename._M_string_length;
  printer.sink_.buffer_ = filename._M_dataplus._M_p;
  annotations.super_Message.super_MessageLite =
       (MessageLite)absl::lts_20250127::NullSafeStringView(".pb.meta");
  absl::lts_20250127::StrCat_abi_cxx11_
            (&info_full_path,(lts_20250127 *)&printer,(AlphaNum *)&annotations,
             (AlphaNum *)&annotations);
  GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
  annotation_collector.annotation_proto_ = &annotations;
  annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
       (_func_int **)&PTR__AnnotationCollector_007931c8;
  output = (ZeroCopyOutputStream *)(**(code **)(*(long *)descriptor + 0x10))(descriptor,&filename);
  pAVar2 = (AlphaNum *)0x0;
  if ((char)file_list != '\0') {
    pAVar2 = (AlphaNum *)&annotation_collector;
  }
  io::Printer::Printer(&printer,output,'$',(AnnotationCollector *)pAVar2);
  puVar1 = *(undefined8 **)(*(long *)((long)&java_package->field_2 + 8) + 8);
  local_1a8._M_str = (char *)*puVar1;
  local_1a8._M_len = puVar1[1];
  text._M_str = 
  "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
  ;
  text._M_len = 0x74;
  io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            (&printer,text,(char (*) [9])"filename",&local_1a8);
  if ((char)generator != '\0') {
    text_00._M_str = "// Protobuf Java Version: $protobuf_java_version$\n";
    text_00._M_len = 0x32;
    io::Printer::Print<char[22],char[11]>
              (&printer,text_00,(char (*) [22])"protobuf_java_version",(char (*) [11])"4.31.0-dev");
  }
  text_01._M_str = "\n";
  text_01._M_len = 1;
  io::Printer::Print<>(&printer,text_01);
  if (package_dir->_M_string_length != 0) {
    text_02._M_str = "package $package$;\n\n";
    text_02._M_len = 0x14;
    io::Printer::Print<char[8],std::__cxx11::string>
              (&printer,text_02,(char (*) [8])0x5cd2c3,package_dir);
  }
  plVar4 = (long *)((long)&(name_suffix->_M_dataplus)._M_p + pfn);
  if (opensource_runtime) {
    pcVar3 = *(code **)(pcVar3 + *plVar4 + -1);
  }
  (*pcVar3)(plVar4,&printer);
  if ((char)file_list != '\0') {
    output_00 = (ZeroCopyOutputStream *)
                (**(code **)(*(long *)descriptor + 0x10))(descriptor,&info_full_path);
    MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,output_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_stack_00000009,annotate_code),&info_full_path);
    if (output_00 != (ZeroCopyOutputStream *)0x0) {
      (*output_00->_vptr_ZeroCopyOutputStream[1])(output_00);
    }
  }
  io::Printer::~Printer(&printer);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
  std::__cxx11::string::~string((string *)&info_full_path);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

static void GenerateSibling(
    const std::string& package_dir, const std::string& java_package,
    const DescriptorClass* descriptor, GeneratorContext* context,
    std::vector<std::string>* file_list, bool annotate_code,
    std::vector<std::string>* annotation_list, const std::string& name_suffix,
    GeneratorClass* generator, bool opensource_runtime,
    void (GeneratorClass::*pfn)(io::Printer* printer)) {
  std::string filename =
      absl::StrCat(package_dir, descriptor->name(), name_suffix, ".java");
  file_list->push_back(filename);
  std::string info_full_path = absl::StrCat(filename, ".pb.meta");
  GeneratedCodeInfo annotations;
  io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
      &annotations);

  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  io::Printer printer(output.get(), '$',
                      annotate_code ? &annotation_collector : nullptr);

  printer.Print(
      "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "// NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "// source: $filename$\n",
      "filename", descriptor->file()->name());
  if (opensource_runtime) {
    printer.Print("// Protobuf Java Version: $protobuf_java_version$\n",
                  "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
  }
  printer.Print("\n");
  if (!java_package.empty()) {
    printer.Print(
        "package $package$;\n"
        "\n",
        "package", java_package);
  }

  (generator->*pfn)(&printer);

  if (annotate_code) {
    std::unique_ptr<io::ZeroCopyOutputStream> info_output(
        context->Open(info_full_path));
    annotations.SerializeToZeroCopyStream(info_output.get());
    annotation_list->push_back(info_full_path);
  }
}